

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_lib_module.cc
# Opt level: O1

PackedFunc * __thiscall
tvm::runtime::SystemLibModuleNode::GetFunction
          (PackedFunc *__return_storage_ptr__,SystemLibModuleNode *this,string *name,
          shared_ptr<tvm::runtime::ModuleNode> *sptr_to_self)

{
  iterator iVar1;
  
  if ((char *)this->module_blob_ != (char *)0x0) {
    ImportModuleBlob((char *)this->module_blob_,&(this->super_ModuleNode).imports_);
    this->module_blob_ = (void *)0x0;
  }
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->tbl_)._M_h,name);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    (__return_storage_ptr__->body_).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->body_)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->body_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->body_).super__Function_base._M_functor + 8) = 0;
  }
  else {
    WrapPackedFunc(__return_storage_ptr__,
                   *(BackendPackedCFunc *)
                    ((long)iVar1.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
                           ._M_cur + 0x28),sptr_to_self);
  }
  return __return_storage_ptr__;
}

Assistant:

PackedFunc GetFunction(
      const std::string &name,
      const std::shared_ptr<ModuleNode> &sptr_to_self) final {
    /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
    //std::lock_guard<std::mutex> lock(mutex_);

    if (module_blob_ != nullptr) {
      // If we previously recorded submodules, load them now.
      ImportModuleBlob(reinterpret_cast<const char *>(module_blob_), &imports_);
      module_blob_ = nullptr;
    }

    auto it = tbl_.find(name);
    if (it != tbl_.end()) {
      return WrapPackedFunc(
          reinterpret_cast<BackendPackedCFunc>(it->second), sptr_to_self);
      return PackedFunc();
    } else {
      return PackedFunc();
    }
  }